

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O3

void __thiscall
diy::stats::ScopedProfile<diy::stats::Profiler>::ScopedProfile
          (ScopedProfile<diy::stats::Profiler> *this,Profiler *prof_,string *name_)

{
  pointer pcVar1;
  Profiler *this_00;
  string local_48;
  
  this->prof = prof_;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  this->active = true;
  this_00 = this->prof;
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->name)._M_string_length);
  Profiler::operator<<(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedProfile(Profiler& prof_, std::string name_):
            prof(prof_), name(name_), active(true)  { prof << name; }